

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_27(QPDF *pdf,char *arg2)

{
  QPDFPageObjectHelper QVar1;
  QPDFPageObjectHelper QVar2;
  undefined1 auVar3 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Provider *pPVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle QVar12;
  QPDFObjectHandle QVar13;
  shared_ptr<Buffer> b;
  QPDFWriter w;
  QPDF oldpdf;
  QPDF empty3;
  QPDFObjectHandle qtest2;
  QPDF empty2;
  QPDF empty1;
  QPDFObjectHandle s3;
  QPDFObjectHandle O3;
  QPDFObjectHandle qtest;
  QPDFObjectHandle trailer;
  QPDFObjectHandle s2;
  element_type *peVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffdc0;
  long in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined1 *puVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffde0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffde8;
  undefined1 local_1e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  QPDF local_1d8 [8];
  QPDF local_1d0 [8];
  QPDFObjectHandle local_1c8;
  QPDF local_1b8 [8];
  QPDF local_1b0 [8];
  Provider *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  undefined8 local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  undefined8 local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  Provider *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  undefined8 local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  undefined1 local_158 [16];
  undefined8 local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  QPDFObjectHandle local_138;
  undefined8 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  undefined8 local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  Provider *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  shared_ptr<Buffer> local_f8;
  Provider *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  Provider *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  shared_ptr<Buffer> local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  string local_a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  QPDFPageObjectHelper local_98;
  QPDFPageObjectHelper local_60;
  
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)&stack0xfffffffffffffdd8,"buffer",(Pipeline *)0x0);
  Pipeline::writeCStr(&stack0xfffffffffffffdd8);
  Pl_Buffer::finish();
  Pl_Buffer::getBufferSharedPointer();
  pPVar5 = (Provider *)operator_new(0x28);
  if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_stack_fffffffffffffdc0._M_pi)->_M_use_count =
           (in_stack_fffffffffffffdc0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_stack_fffffffffffffdc0._M_pi)->_M_use_count =
           (in_stack_fffffffffffffdc0._M_pi)->_M_use_count + 1;
    }
  }
  local_c8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_fffffffffffffdc0._M_pi;
  Provider::Provider(pPVar5,&local_c8);
  if (local_c8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_1e8 = (undefined1  [8])pPVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Provider*>(&_Stack_1e0,pPVar5);
  this._M_pi = _Stack_1e0._M_pi;
  auVar3 = local_1e8;
  if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffdc0._M_pi);
  }
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&stack0xfffffffffffffdd8);
  QPDF::QPDF(local_1b0);
  QPDF::emptyPDF();
  QPDFObjectHandle::newStream((QPDF *)local_1e8);
  local_d8 = (Provider *)auVar3;
  local_d0 = this._M_pi;
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
    }
  }
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData
            (local_1e8,&local_d8,&stack0xfffffffffffffdd8,&stack0xfffffffffffffdb8);
  if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffdc0._M_pi);
  }
  if (in_stack_fffffffffffffde0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffde0);
  }
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
  }
  QPDF::QPDF(local_1b8);
  QPDF::emptyPDF();
  local_e8 = (Provider *)local_1e8;
  local_e0 = _Stack_1e0._M_pi;
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_1e0._M_pi)->_M_use_count = (_Stack_1e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_1e0._M_pi)->_M_use_count = (_Stack_1e0._M_pi)->_M_use_count + 1;
    }
  }
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xfffffffffffffdd8;
  QPDF::copyForeignObject(QVar7);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e8 = (undefined1  [8])in_stack_fffffffffffffdd8;
  _Var4._M_pi = in_stack_fffffffffffffde0;
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var4._M_pi = in_stack_fffffffffffffde0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
    _Stack_1e0._M_pi = _Var4._M_pi;
    _Var4._M_pi = _Stack_1e0._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var4._M_pi = _Stack_1e0._M_pi;
    }
  }
  _Stack_1e0._M_pi = _Var4._M_pi;
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)&stack0xfffffffffffffdd8,"buffer",(Pipeline *)0x0);
  Pipeline::writeCStr(&stack0xfffffffffffffdd8);
  Pl_Buffer::finish();
  Pl_Buffer::getBufferSharedPointer();
  pPVar5 = (Provider *)operator_new(0x28);
  if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_stack_fffffffffffffdc0._M_pi)->_M_use_count =
           (in_stack_fffffffffffffdc0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_stack_fffffffffffffdc0._M_pi)->_M_use_count =
           (in_stack_fffffffffffffdc0._M_pi)->_M_use_count + 1;
    }
  }
  local_f8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_fffffffffffffdc0._M_pi;
  Provider::Provider(pPVar5,&local_f8);
  if (local_f8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_1a8 = pPVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Provider*>(&local_1a0,pPVar5);
  _Var4._M_pi = local_1a0._M_pi;
  pPVar5 = local_1a8;
  if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffdc0._M_pi);
  }
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&stack0xfffffffffffffdd8);
  QPDF::QPDF(local_1d0);
  QPDF::emptyPDF();
  QPDF::setImmediateCopyFrom(SUB81(local_1d0,0));
  QPDFObjectHandle::newStream((QPDF *)&local_1a8);
  local_108 = pPVar5;
  local_100 = _Var4._M_pi;
  if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
    }
  }
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData
            (&local_1a8,&local_108,&stack0xfffffffffffffdd8,&stack0xfffffffffffffdb8);
  if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffdc0._M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if (arg2 != (char *)0x0) {
    QPDF::QPDF(local_1d8);
    QPDF::processFile((char *)local_1d8,arg2);
    QPDF::getTrailer();
    puVar15 = &stack0xfffffffffffffde8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdd8,"/QTest","");
    QPDFObjectHandle::getKey((string *)&local_188);
    if (puVar15 != &stack0xfffffffffffffde8) {
      operator_delete(puVar15,(ulong)((long)&(in_stack_fffffffffffffde8._M_pi)->
                                             _vptr__Sp_counted_base + 1));
    }
    if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffdc0._M_pi)
      ;
    }
    puVar15 = &stack0xfffffffffffffde8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdd8,"/O3","");
    QPDFObjectHandle::getKey((string *)&local_198);
    if (puVar15 != &stack0xfffffffffffffde8) {
      operator_delete(puVar15,(ulong)((long)&(in_stack_fffffffffffffde8._M_pi)->
                                             _vptr__Sp_counted_base + 1));
    }
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)&stack0xfffffffffffffdd8,pdf);
    peVar14 = (element_type *)&stack0xfffffffffffffdc8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdb8,"/OtherPage","");
    QPDFObjectHandle::getKey(local_a8);
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8;
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_60,QVar12);
    QVar1._8_8_ = in_stack_fffffffffffffdc0._M_pi;
    QVar1._0_8_ = peVar14;
    QVar1._16_8_ = in_stack_fffffffffffffdc8;
    QVar1._24_8_ = in_stack_fffffffffffffdd0;
    QVar1._32_8_ = puVar15;
    QVar1.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_00;
    QVar1.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_stack_fffffffffffffde8._M_pi;
    QPDFPageDocumentHelper::addPage(QVar1,SUB81(&stack0xfffffffffffffdd8,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_60);
    _Var6._M_pi = extraout_RDX_00;
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
      _Var6._M_pi = extraout_RDX_01;
    }
    if (peVar14 != (element_type *)&stack0xfffffffffffffdc8) {
      operator_delete(peVar14,in_stack_fffffffffffffdc8 + 1);
      _Var6._M_pi = extraout_RDX_02;
    }
    local_118 = local_198;
    local_110 = local_190;
    if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_190->_M_use_count = local_190->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_190->_M_use_count = local_190->_M_use_count + 1;
      }
    }
    QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var6._M_pi;
    QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_118;
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_98,QVar13);
    QVar2._8_8_ = in_stack_fffffffffffffdc0._M_pi;
    QVar2._0_8_ = peVar14;
    QVar2._16_8_ = in_stack_fffffffffffffdc8;
    QVar2._24_8_ = in_stack_fffffffffffffdd0;
    QVar2._32_8_ = puVar15;
    QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_00;
    QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_stack_fffffffffffffde8._M_pi;
    QPDFPageDocumentHelper::addPage(QVar2,SUB81(&stack0xfffffffffffffdd8,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_98);
    if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
    }
    peVar14 = (element_type *)&stack0xfffffffffffffdc8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdb8,"potato\n","");
    QPDFObjectHandle::newStream((QPDF *)&local_128,(string *)local_1d8);
    if (peVar14 != (element_type *)&stack0xfffffffffffffdc8) {
      operator_delete(peVar14,in_stack_fffffffffffffdc8 + 1);
    }
    QPDF::getTrailer();
    peVar14 = (element_type *)&stack0xfffffffffffffdc8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdb8,"/QTest","");
    local_148 = local_188;
    local_140 = local_180;
    if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_180->_M_use_count = local_180->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_180->_M_use_count = local_180->_M_use_count + 1;
      }
    }
    QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_1c8;
    QPDF::copyForeignObject(QVar8);
    QPDFObjectHandle::replaceKey((string *)&local_138,(QPDFObjectHandle *)&stack0xfffffffffffffdb8);
    if (local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
    }
    if (peVar14 != (element_type *)&stack0xfffffffffffffdc8) {
      operator_delete(peVar14,in_stack_fffffffffffffdc8 + 1);
    }
    peVar14 = (element_type *)&stack0xfffffffffffffdc8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdb8,"/QTest2","")
    ;
    QPDFObjectHandle::newArray();
    QPDFObjectHandle::replaceKeyAndGetNew((string *)&local_1c8,&local_138);
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    if (peVar14 != (element_type *)&stack0xfffffffffffffdc8) {
      operator_delete(peVar14,in_stack_fffffffffffffdc8 + 1);
    }
    local_158._0_8_ = local_1e8;
    local_158._8_8_ = _Stack_1e0._M_pi;
    if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_1e0._M_pi)->_M_use_count = (_Stack_1e0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_1e0._M_pi)->_M_use_count = (_Stack_1e0._M_pi)->_M_use_count + 1;
      }
    }
    QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xfffffffffffffdb8;
    QPDF::copyForeignObject(QVar9);
    QPDFObjectHandle::appendItem(&local_1c8);
    if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffdc0._M_pi)
      ;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
    }
    local_168 = local_128;
    local_160 = local_120;
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_120->_M_use_count = local_120->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_120->_M_use_count = local_120->_M_use_count + 1;
      }
    }
    QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xfffffffffffffdb8;
    QPDF::copyForeignObject(QVar10);
    QPDFObjectHandle::appendItem(&local_1c8);
    if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffdc0._M_pi)
      ;
    }
    if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
    }
    local_178 = local_1a8;
    local_170 = local_1a0._M_pi;
    if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1a0._M_pi)->_M_use_count = (local_1a0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1a0._M_pi)->_M_use_count = (local_1a0._M_pi)->_M_use_count + 1;
      }
    }
    QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xfffffffffffffdb8;
    QPDF::copyForeignObject(QVar11);
    QPDFObjectHandle::appendItem(&local_1c8);
    if (in_stack_fffffffffffffdc0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffdc0._M_pi)
      ;
    }
    if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
    }
    if (local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_138.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_138.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)&stack0xfffffffffffffdd8);
    if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190);
    }
    if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
    }
    QPDF::~QPDF(local_1d8);
    if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
    }
    QPDF::~QPDF(local_1d0);
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    QPDFWriter::QPDFWriter((QPDFWriter *)&stack0xfffffffffffffdd8,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(&stack0xfffffffffffffdd8,0));
    QPDFWriter::setCompressStreams(SUB81(&stack0xfffffffffffffdd8,0));
    QPDFWriter::setDecodeLevel((qpdf_stream_decode_level_e)&stack0xfffffffffffffdd8);
    QPDFWriter::write();
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    QPDF::~QPDF(local_1b8);
    if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
    }
    QPDF::~QPDF(local_1b0);
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x41b,"void test_27(QPDF &, const char *)");
}

Assistant:

static void
test_27(QPDF& pdf, char const* arg2)
{
    // Copy O3 and the page O3 refers to before copying qtest.
    // Should get qtest plus only the O3 page and the page that O3
    // points to. Inherited objects should be preserved. This test
    // also exercises copying from a stream that has a buffer and
    // a provider, including copying a provider multiple times. We
    // also exercise setImmediateCopyFrom.

    // Create a provider. The provider stays in scope.
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> p1;
    {
        // Local scope
        Pl_Buffer pl("buffer");
        pl.writeCStr("new data for stream\n");
        pl.finish();
        auto b = pl.getBufferSharedPointer();
        auto* provider = new Provider(b);
        p1 = decltype(p1)(provider);
    }
    // Create a stream that uses a provider in empty1 and copy it
    // to empty2. It is copied from empty2 to the final pdf.
    QPDF empty1;
    empty1.emptyPDF();
    QPDFObjectHandle s1 = QPDFObjectHandle::newStream(&empty1);
    s1.replaceStreamData(p1, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    QPDF empty2;
    empty2.emptyPDF();
    s1 = empty2.copyForeignObject(s1);
    {
        // Make sure some source PDFs are out of scope when we
        // write.

        std::shared_ptr<QPDFObjectHandle::StreamDataProvider> p2;
        // Create another provider. This one will go out of scope
        // along with its containing qpdf, which has
        // setImmediateCopyFrom(true).
        {
            // Local scope
            Pl_Buffer pl("buffer");
            pl.writeCStr("more data for stream\n");
            pl.finish();
            auto b = pl.getBufferSharedPointer();
            auto* provider = new Provider(b);
            p2 = decltype(p2)(provider);
        }
        QPDF empty3;
        empty3.emptyPDF();
        empty3.setImmediateCopyFrom(true);
        QPDFObjectHandle s3 = QPDFObjectHandle::newStream(&empty3);
        s3.replaceStreamData(p2, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
        assert(arg2 != nullptr);
        QPDF oldpdf;
        oldpdf.processFile(arg2);
        QPDFObjectHandle qtest = oldpdf.getTrailer().getKey("/QTest");
        QPDFObjectHandle O3 = qtest.getKey("/O3");
        QPDFPageDocumentHelper dh(pdf);
        dh.addPage(O3.getKey("/OtherPage"), false);
        dh.addPage(O3, false);
        QPDFObjectHandle s2 = QPDFObjectHandle::newStream(&oldpdf, "potato\n");
        auto trailer = pdf.getTrailer();
        trailer.replaceKey("/QTest", pdf.copyForeignObject(qtest));
        auto qtest2 = trailer.replaceKeyAndGetNew("/QTest2", QPDFObjectHandle::newArray());
        qtest2.appendItem(pdf.copyForeignObject(s1));
        qtest2.appendItem(pdf.copyForeignObject(s2));
        qtest2.appendItem(pdf.copyForeignObject(s3));
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setCompressStreams(false);
    w.setDecodeLevel(qpdf_dl_generalized);
    w.write();
}